

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music.c
# Opt level: O3

int do_play_instrument(obj *instr)

{
  byte bVar1;
  short sVar2;
  monst *pmVar3;
  char cVar4;
  boolean bVar5;
  schar sVar6;
  xchar xVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  char *pcVar11;
  size_t sVar12;
  trap *ptVar13;
  obj *obj;
  ulong uVar14;
  ulong uVar15;
  int tmp;
  uint uVar16;
  uint x;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  char *pcVar21;
  int iVar22;
  long lVar23;
  monst *pmVar24;
  bool bVar25;
  boolean matched [5];
  schar dy;
  schar dz;
  char buf [256];
  int local_17c;
  undefined1 local_178;
  uint local_174;
  char local_16d;
  int local_16c;
  long local_168;
  ulong local_160;
  d_level *local_158;
  ulong local_150;
  long local_148;
  long local_140;
  char local_138 [264];
  
  if ((u._1052_1_ & 2) != 0) {
    pline("You can\'t play music underwater!");
    return 0;
  }
  if (((instr->otyp & 0xfffeU) != 0x106) &&
     (cVar4 = yn_function("Improvise?","yn",'n'), cVar4 == 'n')) {
    if ((((uint)u.uevent & 0xc0) == 0x80) &&
       (cVar4 = yn_function("Play the passtune?","yn",'n'), cVar4 == 'y')) {
      strcpy(local_138,tune);
    }
    else {
      getlin("What tune are you playing? [5 notes, A-G]",local_138);
      mungspaces(local_138);
      if (local_138[0] != '\0') {
        pcVar11 = local_138;
        do {
          pcVar11 = pcVar11 + 1;
          cVar4 = highc(local_138[0]);
          if (cVar4 == 'H') {
            cVar4 = 'B';
          }
          pcVar11[-1] = cVar4;
          local_138[0] = *pcVar11;
        } while (local_138[0] != '\0');
      }
    }
    pcVar11 = xname(instr);
    pcVar11 = the(pcVar11);
    pline("You extract a strange sound from %s!",pcVar11);
    bVar5 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
    if (bVar5 == '\0') {
      return 1;
    }
    exercise(2,'\x01');
    iVar8 = strcmp(local_138,tune);
    if (iVar8 == 0) {
      xVar7 = u.ux;
      local_174 = (int)u.uy - 1;
      do {
        iVar8 = xVar7 + -1;
        do {
          local_17c = iVar8;
          if (((iVar8 - 1U < 0x4f) && (local_174 < 0x15)) &&
             (bVar5 = find_drawbridge(&local_17c,(int *)&local_174), xVar7 = u.ux, bVar5 != '\0')) {
            u.uevent = (u_event)((uint)u.uevent & 0xffffff3f | 0x80);
            if (level->locations[local_17c][(int)local_174].typ != '$') {
              open_drawbridge(local_17c,local_174);
              return 1;
            }
            close_drawbridge(local_17c,local_174);
            return 1;
          }
          iVar8 = local_17c + 1;
        } while (local_17c <= xVar7);
        bVar25 = (int)u.uy < (int)local_174;
        local_174 = local_174 + 1;
        if (bVar25) {
          return 1;
        }
      } while( true );
    }
    if (flags.soundok == '\0') {
      return 1;
    }
    if (((uint)u.uevent & 0xc0) == 0) {
      u.uevent = (u_event)((uint)u.uevent | 0x40);
    }
    uVar9 = (uint)(byte)u.ux;
    uVar17 = (int)u.uy - 1;
    do {
      uVar16 = (int)(char)uVar9 - 2;
      do {
        x = uVar16 + 1;
        if (((uVar16 < 0x4f) && (uVar17 < 0x15)) &&
           ((cVar4 = level->locations[x][uVar17].typ, cVar4 == '\x14' ||
            ((cVar4 == '$' || (iVar8 = is_drawbridge_wall(x,uVar17), -1 < iVar8)))))) {
          local_178 = 0;
          local_17c = 0;
          sVar12 = strlen(local_138);
          if ((int)(uint)sVar12 < 1) {
            return 1;
          }
          uVar14 = 0;
          uVar17 = 0;
          uVar19 = 0;
          goto LAB_001ff50e;
        }
        uVar9 = (uint)u.ux;
        uVar16 = x;
      } while ((int)x <= (int)uVar9);
      bVar25 = (int)u.uy < (int)uVar17;
      uVar17 = uVar17 + 1;
      if (bVar25) {
        return 1;
      }
    } while( true );
  }
  uVar17 = u.uprops[0x1c].intrinsic;
  if (u.uprops[0x1c].intrinsic == 0) {
    pcVar11 = xname(instr);
    the(pcVar11);
    pline("You start playing %s.");
  }
  else {
    pline("What you produce is quite far from music...");
  }
  switch(instr->otyp) {
  case 0xfd:
    if ((uVar17 == 0) && ('\0' < instr->spe)) {
      consume_obj_charge(instr,'\x01');
      pcVar11 = "soft";
      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
        if (u.umonnum == u.umonster) {
          pcVar11 = "elevator";
        }
        else {
          bVar5 = dmgtype(youmonst.data,0x24);
          pcVar11 = "soft";
          if (bVar5 == '\0') {
            pcVar11 = "elevator";
          }
        }
      }
      pline("You produce %s music.",pcVar11);
      iVar8 = u.ulevel;
      pmVar24 = level->monlist;
      if (pmVar24 != (monst *)0x0) {
        iVar10 = u.ulevel * 5;
        do {
          if ((0 < pmVar24->mhp) &&
             (iVar20 = dist2((int)pmVar24->mx,(int)pmVar24->my,(int)u.ux,(int)u.uy),
             SBORROW4(iVar20,iVar10) != iVar20 + iVar8 * -5 < 0)) {
            iVar20 = 10;
            iVar22 = -10;
            do {
              uVar17 = mt_random();
              iVar20 = iVar20 + uVar17 % 10;
              iVar22 = iVar22 + 1;
            } while (iVar22 != 0);
            iVar20 = sleep_monst(pmVar24,iVar20,6);
            if (iVar20 != 0) {
              pmVar24->field_0x62 = pmVar24->field_0x62 | 8;
              slept_monst(pmVar24);
            }
          }
          pmVar24 = pmVar24->nmon;
        } while (pmVar24 != (monst *)0x0);
      }
      exercise(3,'\x01');
      iVar8 = 0xfd;
LAB_002001d4:
      makeknown_msg(iVar8);
      return 2;
    }
  case 0xfc:
    sVar6 = acurr(3);
    uVar9 = mt_random();
    bVar25 = 0x19 < SUB164(ZEXT416(uVar9) % SEXT816((long)sVar6),0) + u.ulevel;
    pcVar11 = "toot";
    if (uVar17 == 0 && bVar25) {
      pcVar11 = "trill";
    }
    pcVar11 = Tobjnam(instr,pcVar11);
    pline("%s.",pcVar11);
    iVar8 = u.ulevel;
    if ((uVar17 == 0 && bVar25) && (pmVar24 = level->monlist, pmVar24 != (monst *)0x0)) {
      iVar10 = u.ulevel * 3;
      do {
        if ((((0 < pmVar24->mhp) && (pmVar24->data->mlet == '-')) &&
            ((pmVar24->field_0x62 & 4) != 0)) &&
           (iVar20 = dist2((int)pmVar24->mx,(int)pmVar24->my,(int)u.ux,(int)u.uy),
           SBORROW4(iVar20,iVar10) != iVar20 + iVar8 * -3 < 0)) {
          uVar17 = *(uint *)&pmVar24->field_0x60;
          uVar9 = uVar17 & 0xffbf7fff | 0x400000;
          *(uint *)&pmVar24->field_0x60 = uVar9;
          if (pmVar24->wormno == '\0') {
            if ((viz_array[pmVar24->my][pmVar24->mx] & 2U) != 0) goto LAB_001ff291;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001ff22c;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001ff223;
            }
            else {
LAB_001ff223:
              if (ublindf == (obj *)0x0) goto LAB_001ff2f8;
LAB_001ff22c:
              if (ublindf->oartifact != '\x1d') goto LAB_001ff2f8;
            }
            if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
               (((youmonst.data)->mflags3 & 0x100) == 0)) goto LAB_001ff2f8;
            bVar25 = false;
            if (((viz_array[pmVar24->my][pmVar24->mx] & 1U) != 0) &&
               ((pmVar24->data->mflags3 & 0x200) != 0)) goto LAB_001ff291;
          }
          else {
            bVar5 = worm_known(level,pmVar24);
            uVar9 = *(uint *)&pmVar24->field_0x60;
            if (bVar5 == '\0') {
LAB_001ff2f8:
              bVar25 = false;
            }
            else {
LAB_001ff291:
              if ((((uVar9 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                if ((char)uVar9 < '\0') goto LAB_001ff2f8;
              }
              else {
                bVar25 = false;
                if (((char)uVar9 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0))
                goto LAB_001ff2fb;
              }
              bVar25 = (u._1052_1_ & 0x20) == 0 && (uVar9 >> 9 & 1) == 0;
            }
          }
LAB_001ff2fb:
          *(uint *)&pmVar24->field_0x60 = uVar9 & 0xffffff7f;
          newsym((int)pmVar24->mx,(int)pmVar24->my);
          if (pmVar24->wormno == '\0') {
            if ((viz_array[pmVar24->my][pmVar24->mx] & 2U) != 0) goto LAB_001ff3de;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001ff370;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001ff367;
            }
            else {
LAB_001ff367:
              if (ublindf == (obj *)0x0) goto LAB_001ff489;
LAB_001ff370:
              if (ublindf->oartifact != '\x1d') goto LAB_001ff489;
            }
            if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                 (((youmonst.data)->mflags3 & 0x100) == 0)) ||
                ((viz_array[pmVar24->my][pmVar24->mx] & 1U) == 0)) ||
               ((pmVar24->data->mflags3 & 0x200) == 0)) goto LAB_001ff489;
          }
          else {
            bVar5 = worm_known(level,pmVar24);
            if (bVar5 == '\0') goto LAB_001ff489;
          }
LAB_001ff3de:
          uVar9 = *(uint *)&pmVar24->field_0x60;
          if ((((uVar9 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar9 & 0x280) == 0) goto LAB_001ff42c;
          }
          else if (((uVar9 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001ff42c:
            if ((u._1052_1_ & 0x20) == 0) {
              if (bVar25) {
                pcVar11 = Monnam(pmVar24);
                pcVar21 = "";
                if ((uVar17 >> 0x16 & 1) == 0) {
                  pcVar21 = ", and now seems quieter";
                }
                pline("%s freezes, then sways with the music%s.",pcVar11,pcVar21);
              }
              else {
                pcVar11 = a_monnam(pmVar24);
                pline("You notice %s, swaying with the music.",pcVar11);
              }
            }
          }
        }
LAB_001ff489:
        pmVar24 = pmVar24->nmon;
      } while (pmVar24 != (monst *)0x0);
    }
    break;
  case 0xff:
  case 0x100:
    if ((uVar17 == 0) && ('\0' < instr->spe)) {
      consume_obj_charge(instr,'\x01');
      iVar8 = getdir((char *)0x0,(schar *)&local_17c,(schar *)&local_174,&local_16d);
      if (iVar8 == 0) {
        pcVar11 = Tobjnam(instr,"vibrate");
        pline("%s.",pcVar11);
        return 2;
      }
      if ((((char)local_17c == '\0') && ((char)local_174 == '\0')) && (local_16d == '\0')) {
        iVar8 = zapyourself(instr,'\x01');
        if (iVar8 != 0) {
          sprintf(local_138,"using a magical horn on %sself",
                  *(undefined8 *)
                   ((long)&genders[0].him + (ulong)((uint)(flags.female != '\0') * 0x30)));
          losehp(iVar8,local_138,1);
        }
      }
      else {
        sVar2 = instr->otyp;
        uVar17 = mt_random();
        buzz((sVar2 == 0xff) + 1,uVar17 % 6 + 6,u.ux,u.uy,(int)(char)local_17c,(int)(char)local_174)
        ;
      }
      iVar8 = (int)instr->otyp;
      goto LAB_002001d4;
    }
  case 0xfe:
    pline("You produce a frightful, grave sound.");
    iVar8 = u.ulevel * 0x1e;
LAB_001ff4c9:
    awaken_monsters(iVar8);
LAB_001ff4ce:
    exercise(2,'\0');
    return 2;
  default:
    warning("What a weird instrument (%d)!",(ulong)(uint)(int)instr->otyp);
    return 2;
  case 0x103:
    if ((uVar17 == 0) && ('\0' < instr->spe)) {
      consume_obj_charge(instr,'\x01');
      pcVar11 = Tobjnam(instr,"produce");
      pline("%s very attractive music.",pcVar11);
      if ((u._1052_1_ & 1) == 0) {
        if (level->monlist != (monst *)0x0) {
          iVar8 = u.ulevel + -1;
          pmVar24 = level->monlist;
          do {
            pmVar3 = pmVar24->nmon;
            if (((0 < pmVar24->mhp) &&
                (iVar10 = dist2((int)pmVar24->mx,(int)pmVar24->my,(int)u.ux,(int)u.uy),
                iVar10 <= iVar8 / 3 + 1)) && (iVar10 = resist(pmVar24,'\x06',0,0), iVar10 == 0)) {
              tamedog(pmVar24,(obj *)0x0);
            }
            pmVar24 = pmVar3;
          } while (pmVar3 != (monst *)0x0);
        }
      }
      else {
        iVar8 = resist(u.ustuck,'\x06',0,0);
        if (iVar8 == 0) {
          tamedog(u.ustuck,(obj *)0x0);
        }
      }
      exercise(3,'\x01');
      iVar8 = 0x103;
      goto LAB_002001d4;
    }
  case 0x102:
    sVar6 = acurr(3);
    uVar9 = mt_random();
    bVar25 = 0x19 < SUB164(ZEXT416(uVar9) % SEXT816((long)sVar6),0) + u.ulevel;
    pcVar11 = xname(instr);
    pcVar11 = The(pcVar11);
    pcVar21 = "twangs";
    if (uVar17 == 0 && bVar25) {
      pcVar21 = "produces a lilting melody";
    }
    pline("%s %s.",pcVar11,pcVar21);
    iVar8 = u.ulevel;
    if ((uVar17 == 0 && bVar25) && (pmVar24 = level->monlist, pmVar24 != (monst *)0x0)) {
      iVar10 = u.ulevel * 3;
      do {
        if (((0 < pmVar24->mhp) && (pmVar24->data->mlet == '\x0e')) &&
           (((pmVar24->field_0x62 & 4) != 0 &&
            (iVar20 = dist2((int)pmVar24->mx,(int)pmVar24->my,(int)u.ux,(int)u.uy),
            SBORROW4(iVar20,iVar10) != iVar20 + iVar8 * -3 < 0)))) {
          uVar17 = *(uint *)&pmVar24->field_0x60 & 0xffb77fff | 0x400000;
          *(uint *)&pmVar24->field_0x60 = uVar17;
          if (pmVar24->wormno == '\0') {
            if ((viz_array[pmVar24->my][pmVar24->mx] & 2U) != 0) goto LAB_001ff015;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001fefbb;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001fefb2;
            }
            else {
LAB_001fefb2:
              if (ublindf == (obj *)0x0) goto LAB_001ff082;
LAB_001fefbb:
              if (ublindf->oartifact != '\x1d') goto LAB_001ff082;
            }
            if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                 (((youmonst.data)->mflags3 & 0x100) == 0)) ||
                ((viz_array[pmVar24->my][pmVar24->mx] & 1U) == 0)) ||
               ((pmVar24->data->mflags3 & 0x200) == 0)) goto LAB_001ff082;
          }
          else {
            bVar5 = worm_known(level,pmVar24);
            if (bVar5 == '\0') goto LAB_001ff082;
            uVar17 = *(uint *)&pmVar24->field_0x60;
          }
LAB_001ff015:
          if ((((uVar17 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar17 & 0x280) == 0) goto LAB_001ff059;
          }
          else if (((uVar17 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001ff059:
            if ((u._1052_1_ & 0x20) == 0) {
              pcVar11 = Monnam(pmVar24);
              pline("%s listens cheerfully to the music, then seems quieter.",pcVar11);
            }
          }
        }
LAB_001ff082:
        pmVar24 = pmVar24->nmon;
      } while (pmVar24 != (monst *)0x0);
    }
    break;
  case 0x105:
    pcVar11 = xname(instr);
    the(pcVar11);
    pline("You extract a loud noise from %s.");
    awaken_soldiers();
    goto LAB_001ff4ce;
  case 0x106:
    goto switchD_001fecc5_caseD_106;
  case 0x107:
    if ((uVar17 == 0) && ('\0' < instr->spe)) {
      consume_obj_charge(instr,'\x01');
      pline("You produce a heavy, thunderous rolling!");
      pcVar11 = get_generic_level_description(level);
      pline("The entire %s is shaking around you!",pcVar11);
      iVar10 = (u.ulevel + -1) / 3;
      iVar8 = iVar10 * 2 + 2;
      uVar9 = (int)u.ux + iVar10 * 2 + 2;
      uVar17 = u.ux - iVar8;
      if ((int)uVar17 < 2) {
        uVar17 = 1;
      }
      uVar16 = 0x4f;
      if ((int)uVar9 < 0x4f) {
        uVar16 = uVar9;
      }
      if ((int)uVar17 <= (int)uVar16) {
        iVar20 = iVar8 + u.uy;
        local_16c = 0x14;
        if (iVar20 < 0x14) {
          local_16c = iVar20;
        }
        uVar9 = u.uy - iVar8;
        if ((int)uVar9 < 2) {
          uVar9 = 1;
        }
        local_160 = (ulong)uVar9;
        local_140 = (long)(0xd - iVar10);
        local_148 = (long)local_16c;
        uVar14 = (ulong)uVar17;
        local_150 = (ulong)uVar16;
        lVar18 = uVar14 * 0xa8 + 0x8380;
        local_168 = uVar14 * 0xfc + local_160 * 0xc + 0x46;
        local_158 = &dungeon_topology.d_astral_level;
        do {
          uVar19 = local_160;
          lVar23 = local_168;
          if ((int)local_160 <= local_16c) {
            do {
              pmVar24 = *(monst **)(level->levname + uVar19 * 8 + lVar18);
              iVar8 = (int)uVar14;
              iVar10 = (int)uVar19;
              if ((pmVar24 != (monst *)0x0) && ((pmVar24->field_0x61 & 2) == 0)) {
                wakeup(pmVar24);
                if (((char)*(uint *)&pmVar24->field_0x60 < '\0') &&
                   ((pmVar24->data->mflags1 & 0x100) != 0)) {
                  *(uint *)&pmVar24->field_0x60 = *(uint *)&pmVar24->field_0x60 & 0xffffff7f;
                  if ((viz_array[uVar19][uVar14] & 2U) == 0) {
                    You_hear("a thumping sound.");
                  }
                  else {
                    pcVar11 = Amonnam(pmVar24);
                    pline("%s is shaken loose from the ceiling!",pcVar11);
                  }
                  if ((uVar14 == (uint)(int)u.ux) && (uVar19 == (uint)(int)u.uy)) {
                    pcVar11 = mon_nam(pmVar24);
                    pline("You easily dodge the falling %s.",pcVar11);
                  }
                  newsym(iVar8,iVar10);
                }
              }
              uVar17 = mt_random();
              if (SUB168(ZEXT416(uVar17) % SEXT816(local_140),0) != 0)
              goto switchD_001ffbe9_caseD_1a;
              switch(level->levname[lVar23 + -2]) {
              case '\x17':
                if ((*(ushort *)(level->levname + lVar23) & 0x1f0) == 0)
                goto switchD_001ffbe9_caseD_18;
                iVar20 = artifact_door(level,iVar8,iVar10);
                if (iVar20 != 0) goto switchD_001ffbe9_caseD_1a;
                if ((viz_array[uVar19][uVar14] & 2U) != 0) {
                  pline("The door collapses.");
                }
                pcVar11 = in_rooms(level,(xchar)uVar14,(xchar)uVar19,0x12);
                if (*pcVar11 != '\0') {
                  add_damage((xchar)uVar14,(xchar)uVar19,0);
                }
                *(uint *)(level->levname + lVar23) = *(uint *)(level->levname + lVar23) & 0xfffffe0f
                ;
                unblock_point(iVar8,iVar10);
                goto LAB_001fff35;
              case '\x18':
              case '\x19':
                goto switchD_001ffbe9_caseD_18;
              default:
                goto switchD_001ffbe9_caseD_1a;
              case '\x1c':
                pcVar11 = "The fountain falls into a chasm.";
                if ((viz_array[uVar19][uVar14] & 2U) == 0) goto switchD_001ffbe9_caseD_18;
                goto LAB_001ffc99;
              case '\x1d':
                bVar1 = viz_array[uVar19][uVar14];
                pcVar11 = "The throne falls into a chasm.";
                break;
              case '\x1f':
                bVar1 = viz_array[uVar19][uVar14];
                pcVar11 = "The kitchen sink falls into a chasm.";
                break;
              case ' ':
                bVar1 = viz_array[uVar19][uVar14];
                pcVar11 = "The headstone topples into a chasm.";
                break;
              case '!':
                bVar5 = on_level(&u.uz,local_158);
                if ((bVar5 == '\0') &&
                   (bVar5 = on_level(&u.uz,&dungeon_topology.d_sanctum_level), bVar5 == '\0')) {
                  bVar1 = viz_array[uVar19][uVar14];
                  pcVar11 = "The altar falls into a chasm.";
                  break;
                }
                goto switchD_001ffbe9_caseD_1a;
              }
              if ((bVar1 & 2) != 0) {
LAB_001ffc99:
                pline(pcVar11);
              }
switchD_001ffbe9_caseD_18:
              ptVar13 = maketrap(level,iVar8,iVar10,0xb);
              if (ptVar13 != (trap *)0x0) {
                ptVar13->field_0x8 = ptVar13->field_0x8 | 0x20;
                *(uint *)(level->levname + lVar23) = *(uint *)(level->levname + lVar23) & 0xfffffe0f
                ;
                pmVar24 = *(monst **)(level->levname + uVar19 * 8 + lVar18);
                if (pmVar24 == (monst *)0x0) {
                  obj = sobj_at(0x214,level,iVar8,iVar10);
                  if (obj != (obj *)0x0) {
                    pmVar24 = (monst *)0x0;
                    goto LAB_001ffd32;
                  }
LAB_001ffede:
                  if (((u.utrap != 0) || (uVar14 != (uint)(int)u.ux)) || (uVar19 != (uint)(int)u.uy)
                     ) {
LAB_001fff35:
                    newsym(iVar8,iVar10);
                    goto switchD_001ffbe9_caseD_1a;
                  }
                  if (((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
                      ((youmonst.data)->mlet != '\x05')) &&
                     ((u.uprops[0x3c].extrinsic == 0 &&
                      (uVar17 = (youmonst.data)->mflags1, (uVar17 & 1) == 0)))) {
                    if (u.usteed == (monst *)0x0) {
                      if ((uVar17 & 0x10) == 0) goto LAB_00200054;
                    }
                    else if ((uVar17 & 0x10) == 0 && ((u.usteed)->data->mflags1 & 1) == 0) {
LAB_00200054:
                      pline("You fall into a chasm!");
                      uVar17 = mt_random();
                      u.utrap = uVar17 % 6 + 2;
                      u.utraptype = 1;
                      uVar17 = mt_random();
                      losehp(uVar17 % 6 + 1,"fell into a chasm",2);
                      selftouch("Falling, you");
                      goto switchD_001ffbe9_caseD_1a;
                    }
                  }
                  pline("A chasm opens up under you!");
                  pline("You don\'t fall in!");
                }
                else {
                  if ((*(uint *)&pmVar24->field_0x60 >> 9 & 1) != 0) {
                    pmVar24 = (monst *)0x0;
                  }
                  obj = sobj_at(0x214,level,iVar8,iVar10);
                  if (obj == (obj *)0x0) {
                    if (pmVar24 == (monst *)0x0) goto LAB_001ffede;
                    if ((pmVar24->data->mflags1 & 0x11) == 0) {
                      pmVar24->field_0x62 = pmVar24->field_0x62 | 0x80;
                      if ((viz_array[uVar19][uVar14] & 2U) == 0) {
                        if ((flags.soundok != '\0') && ((pmVar24->data->mflags1 & 0x20000) != 0)) {
                          You_hear("a scream!");
                        }
                      }
                      else {
                        pcVar11 = Monnam(pmVar24);
                        pline("%s falls into a chasm!",pcVar11);
                      }
                      mselftouch(pmVar24,"Falling, ",'\x01');
                      if (0 < pmVar24->mhp) {
                        uVar17 = mt_random();
                        iVar8 = ~(uVar17 % 6) + pmVar24->mhp;
                        pmVar24->mhp = iVar8;
                        if (iVar8 < 1) {
                          if ((viz_array[uVar19][uVar14] & 2U) == 0) {
                            pline("It is destroyed!");
                          }
                          else {
                            if (pmVar24->mtame == '\0') {
                              mon_nam(pmVar24);
                            }
                            else {
                              x_monnam(pmVar24,1,"poor",(uint)(pmVar24->mnamelth != '\0') << 3,'\0')
                              ;
                            }
                            pline("You destroy %s!");
                          }
                          xkilled(pmVar24,0);
                        }
                      }
                    }
                  }
                  else {
LAB_001ffd32:
                    if ((viz_array[uVar19][uVar14] & 2U) != 0) {
                      pcVar11 = "";
                      if ((uint)(int)u.uy == uVar19 && (uint)(int)u.ux == uVar14) {
                        pcVar11 = " below you";
                      }
                      pline("KADOOM! The boulder falls into a chasm%s!",pcVar11);
                    }
                    if (pmVar24 != (monst *)0x0) {
                      pmVar24->field_0x62 = pmVar24->field_0x62 & 0x7f;
                    }
                    obj_extract_self(obj);
                    flooreffects(obj,iVar8,iVar10,"");
                  }
                }
              }
switchD_001ffbe9_caseD_1a:
              bVar25 = (long)uVar19 < local_148;
              uVar19 = uVar19 + 1;
              lVar23 = lVar23 + 0xc;
            } while (bVar25);
          }
          lVar18 = lVar18 + 0xa8;
          local_168 = local_168 + 0xfc;
          bVar25 = uVar14 < local_150;
          uVar14 = uVar14 + 1;
        } while (bVar25);
      }
      awaken_monsters(0x690);
      iVar8 = 0x107;
      goto LAB_002001d4;
    }
    goto switchD_001fecc5_caseD_106;
  }
  exercise(3,'\x01');
  return 2;
LAB_001ff50e:
  if (uVar14 < 5) {
    cVar4 = local_138[uVar14];
    if (cVar4 == tune[uVar14]) {
      uVar17 = uVar17 + 1;
      uVar15 = uVar14;
LAB_001ff524:
      *(undefined1 *)((long)&local_17c + uVar15) = 1;
    }
    else {
      uVar15 = 0;
      do {
        if (((*(char *)((long)&local_17c + uVar15) == '\0') && (cVar4 == tune[uVar15])) &&
           (local_138[uVar15] != cVar4)) {
          uVar19 = (ulong)((int)uVar19 + 1);
          goto LAB_001ff524;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != 5);
    }
  }
  uVar14 = uVar14 + 1;
  if (uVar14 == ((uint)sVar12 & 0x7fffffff)) {
    if ((int)uVar19 != 0) {
      pcVar21 = "s";
      pcVar11 = "s";
      if ((int)uVar19 == 1) {
        pcVar11 = "";
      }
      if (uVar17 == 0) {
        You_hear("%d tumbler%s click.",uVar19,pcVar11);
        return 1;
      }
      if (uVar17 == 1) {
        pcVar21 = "";
      }
      You_hear("%d tumbler%s click and %d gear%s turn.",uVar19,pcVar11,(ulong)uVar17,pcVar21);
      return 1;
    }
    if (uVar17 == 0) {
      return 1;
    }
    pcVar11 = "s";
    if (uVar17 == 1) {
      pcVar11 = "";
    }
    You_hear("%d gear%s turn.",(ulong)uVar17,pcVar11);
    if (uVar17 == 5) {
      u.uevent = (u_event)((uint)u.uevent & 0xffffff3f | 0x80);
      return 1;
    }
    return 1;
  }
  goto LAB_001ff50e;
switchD_001fecc5_caseD_106:
  pline("You beat a deafening row!");
  iVar8 = u.ulevel * 0x28;
  goto LAB_001ff4c9;
}

Assistant:

int do_play_instrument(struct obj *instr)
{
    char buf[BUFSZ], c = 'y';
    char *s;
    int x,y;
    boolean ok;

    if (Underwater) {
	pline("You can't play music underwater!");
	return 0;
    }
    if (instr->otyp != LEATHER_DRUM && instr->otyp != DRUM_OF_EARTHQUAKE) {
	c = yn("Improvise?");
    }
    if (c == 'n') {
	if (u.uevent.uheard_tune == 2 && yn("Play the passtune?") == 'y') {
	    strcpy(buf, tune);
	} else {
	    getlin("What tune are you playing? [5 notes, A-G]", buf);
	    mungspaces(buf);
	    /* convert to uppercase and change any "H" to the expected "B" */
	    for (s = buf; *s; s++) {
		*s = highc(*s);
		if (*s == 'H') *s = 'B';
	    }
	}
	pline("You extract a strange sound from %s!", the(xname(instr)));
	
	/* Check if there was the Stronghold drawbridge near
	 * and if the tune conforms to what we're waiting for.
	 */
	if (Is_stronghold(&u.uz)) {
	    exercise(A_WIS, TRUE);		/* just for trying */
	    if (!strcmp(buf,tune)) {
		/* Search for the drawbridge */
		for (y=u.uy-1; y<=u.uy+1; y++)
		    for (x=u.ux-1;x<=u.ux+1;x++)
			if (isok(x,y))
			if (find_drawbridge(&x,&y)) {
			    u.uevent.uheard_tune = 2; /* tune now fully known */
			    if (level->locations[x][y].typ == DRAWBRIDGE_DOWN)
				close_drawbridge(x,y);
			    else
				open_drawbridge(x,y);
			    return 1;
			}
	    } else if (flags.soundok) {
		if (u.uevent.uheard_tune < 1) u.uevent.uheard_tune = 1;
		/* Okay, it wasn't the right tune, but perhaps
		 * we can give the player some hints like in the
		 * Mastermind game */
		ok = FALSE;
		for (y = u.uy-1; y <= u.uy+1 && !ok; y++)
		    for (x = u.ux-1; x <= u.ux+1 && !ok; x++)
			if (isok(x,y))
			if (IS_DRAWBRIDGE(level->locations[x][y].typ) ||
			   is_drawbridge_wall(x,y) >= 0)
				ok = TRUE;
		if (ok) { /* There is a drawbridge near */
		    int tumblers, gears;
		    boolean matched[5];

		    tumblers = gears = 0;
		    for (x=0; x < 5; x++)
			matched[x] = FALSE;

		    for (x=0; x < (int)strlen(buf); x++)
			if (x < 5) {
			    if (buf[x] == tune[x]) {
				gears++;
				matched[x] = TRUE;
			    } else
				for (y=0; y < 5; y++)
				    if (!matched[y] &&
				       buf[x] == tune[y] &&
				       buf[y] != tune[y]) {
					tumblers++;
					matched[y] = TRUE;
					break;
				    }
			}
		    if (tumblers)
			if (gears)
			    You_hear("%d tumbler%s click and %d gear%s turn.",
				tumblers, plur(tumblers), gears, plur(gears));
			else
			    You_hear("%d tumbler%s click.",
				tumblers, plur(tumblers));
		    else if (gears) {
			You_hear("%d gear%s turn.", gears, plur(gears));
			/* could only get `gears == 5' by playing five
			   correct notes followed by excess; otherwise,
			   tune would have matched above */
			if (gears == 5) u.uevent.uheard_tune = 2;
		    }
		}
	    }
	  }
	return 1;
    } else
	    return do_improvisation(instr);
}